

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprContinue * AnalyzeContinue(ExpressionContext *ctx,SynContinue *syntax)

{
  SynNumber *source;
  TypeBase *pTVar1;
  ScopeData *scopeData;
  int iVar2;
  ExprBase *pEVar3;
  undefined4 extraout_var;
  FunctionData *onwerFunction;
  char *msg;
  ExpressionContext *this;
  uint depth;
  _func_int **pp_Var5;
  ExprContinue *pEVar4;
  
  if (syntax->number == (SynNumber *)0x0) {
    pp_Var5 = (_func_int **)0x1;
  }
  else {
    pEVar3 = AnalyzeExpression(ctx,&syntax->number->super_SynBase);
    source = syntax->number;
    pEVar3 = CreateCast(ctx,&source->super_SynBase,pEVar3,ctx->typeLong,false);
    pEVar3 = anon_unknown.dwarf_ff84f::EvaluateExpression(ctx,&source->super_SynBase,pEVar3);
    if ((pEVar3 == (ExprBase *)0x0) || (pEVar3->typeID != 6)) {
      syntax = (SynContinue *)syntax->number;
      msg = "ERROR: continue statement must be followed by \';\' or a constant";
      goto LAB_001df89a;
    }
    pp_Var5 = pEVar3[1]._vptr_ExprBase;
    if ((long)pp_Var5 < 1) {
      syntax = (SynContinue *)syntax->number;
      msg = "ERROR: continue level can\'t be negative or zero";
      goto LAB_001df89a;
    }
  }
  depth = (uint)pp_Var5;
  if (depth <= ctx->scope->contiueDepth) {
    this = (ExpressionContext *)ctx->allocator;
    iVar2 = (*(*(_func_int ***)this)[2])(this,0x38);
    pEVar4 = (ExprContinue *)CONCAT44(extraout_var,iVar2);
    pTVar1 = ctx->typeVoid;
    scopeData = ctx->scope;
    onwerFunction = ExpressionContext::GetCurrentFunction(this,scopeData);
    pEVar3 = CreateContinueUpvalueClose(ctx,&syntax->super_SynBase,onwerFunction,scopeData,depth);
    (pEVar4->super_ExprBase).typeID = 0x35;
    (pEVar4->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar4->super_ExprBase).type = pTVar1;
    (pEVar4->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar4->super_ExprBase).listed = false;
    (pEVar4->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e40f0;
    *(uint *)&(pEVar4->super_ExprBase).field_0x2c = depth;
    pEVar4->closures = pEVar3;
    return pEVar4;
  }
  msg = "ERROR: continue level is greater that loop depth";
LAB_001df89a:
  anon_unknown.dwarf_ff84f::Stop(ctx,&syntax->super_SynBase,msg);
}

Assistant:

ExprContinue* AnalyzeContinue(ExpressionContext &ctx, SynContinue *syntax)
{
	unsigned depth = 1;

	if(syntax->number)
	{
		ExprBase *numberValue = AnalyzeExpression(ctx, syntax->number);

		if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, syntax->number, CreateCast(ctx, syntax->number, numberValue, ctx.typeLong, false))))
		{
			if(number->value <= 0)
				Stop(ctx, syntax->number, "ERROR: continue level can't be negative or zero");

			depth = unsigned(number->value);
		}
		else
		{
			Stop(ctx, syntax->number, "ERROR: continue statement must be followed by ';' or a constant");
		}
	}

	if(ctx.scope->contiueDepth < depth)
		Stop(ctx, syntax, "ERROR: continue level is greater that loop depth");

	return new (ctx.get<ExprContinue>()) ExprContinue(syntax, ctx.typeVoid, depth, CreateContinueUpvalueClose(ctx, syntax, ctx.GetCurrentFunction(ctx.scope), ctx.scope, depth));
}